

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyRigidBodyCollisionConfiguration.cpp
# Opt level: O2

btCollisionAlgorithmCreateFunc * __thiscall
btSoftBodyRigidBodyCollisionConfiguration::getCollisionAlgorithmCreateFunc
          (btSoftBodyRigidBodyCollisionConfiguration *this,int proxyType0,int proxyType1)

{
  btCollisionAlgorithmCreateFunc *pbVar1;
  
  if (proxyType1 == 0x20 && proxyType0 == 0x20) {
    return this->m_softSoftCreateFunc;
  }
  if (proxyType0 == 0x20) {
    if (proxyType1 < 0x14) {
      return this->m_softRigidConvexCreateFunc;
    }
    if (proxyType1 - 0x15U < 9) {
      return this->m_softRigidConcaveCreateFunc;
    }
  }
  else {
    if (proxyType0 < 0x14 && proxyType1 == 0x20) {
      return this->m_swappedSoftRigidConvexCreateFunc;
    }
    if (proxyType0 - 0x15U < 9 && proxyType1 == 0x20) {
      return this->m_swappedSoftRigidConcaveCreateFunc;
    }
  }
  pbVar1 = btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc
                     (&this->super_btDefaultCollisionConfiguration,proxyType0,proxyType1);
  return pbVar1;
}

Assistant:

btCollisionAlgorithmCreateFunc* btSoftBodyRigidBodyCollisionConfiguration::getCollisionAlgorithmCreateFunc(int proxyType0,int proxyType1)
{

	///try to handle the softbody interactions first

	if ((proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  ) && (proxyType1==SOFTBODY_SHAPE_PROXYTYPE))
	{
		return	m_softSoftCreateFunc;
	}

	///softbody versus convex
	if (proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  && btBroadphaseProxy::isConvex(proxyType1))
	{
		return	m_softRigidConvexCreateFunc;
	}

	///convex versus soft body
	if (btBroadphaseProxy::isConvex(proxyType0) && proxyType1 == SOFTBODY_SHAPE_PROXYTYPE )
	{
		return	m_swappedSoftRigidConvexCreateFunc;
	}

#ifdef ENABLE_SOFTBODY_CONCAVE_COLLISIONS
	///softbody versus convex
	if (proxyType0 == SOFTBODY_SHAPE_PROXYTYPE  && btBroadphaseProxy::isConcave(proxyType1))
	{
		return	m_softRigidConcaveCreateFunc;
	}

	///convex versus soft body
	if (btBroadphaseProxy::isConcave(proxyType0) && proxyType1 == SOFTBODY_SHAPE_PROXYTYPE )
	{
		return	m_swappedSoftRigidConcaveCreateFunc;
	}
#endif

	///fallback to the regular rigid collision shape
	return btDefaultCollisionConfiguration::getCollisionAlgorithmCreateFunc(proxyType0,proxyType1);
}